

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockTests.cpp
# Opt level: O1

void deqp::createRandomCaseGroup
               (TestCaseGroup *parentGroup,Context *context,char *groupName,char *description,
               GLSLVersion glslVersion,BufferMode bufferMode,deUint32 features,int numCases,
               deUint32 baseSeed)

{
  int iVar1;
  uint uVar2;
  TestNode *node;
  RandomUniformBlockCase *this;
  int iVar3;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,context->m_testCtx,groupName,description);
  tcu::TestNode::addChild(&parentGroup->super_TestNode,node);
  iVar1 = tcu::CommandLine::getBaseSeed(context->m_testCtx->m_cmdLine);
  if (0 < numCases) {
    iVar3 = 0;
    do {
      this = (RandomUniformBlockCase *)operator_new(0xe8);
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar2 = iVar3 + iVar1 + baseSeed;
      uVar2 = (uVar2 >> 0x10 ^ uVar2 ^ 0x3d) * 9;
      uVar2 = (uVar2 >> 4 ^ uVar2) * 0x27d4eb2d;
      RandomUniformBlockCase::RandomUniformBlockCase
                (this,context,(char *)local_1c8,glcts::fixed_sample_locations_values + 1,glslVersion
                 ,bufferMode,features,uVar2 >> 0xf ^ uVar2);
      tcu::TestNode::addChild(node,(TestNode *)this);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      iVar3 = iVar3 + 1;
    } while (numCases != iVar3);
  }
  return;
}

Assistant:

static void createRandomCaseGroup(tcu::TestCaseGroup* parentGroup, Context& context, const char* groupName,
								  const char* description, glu::GLSLVersion glslVersion,
								  UniformBlockCase::BufferMode bufferMode, deUint32 features, int numCases,
								  deUint32 baseSeed)
{
	tcu::TestCaseGroup* group = new tcu::TestCaseGroup(context.getTestContext(), groupName, description);
	parentGroup->addChild(group);

	baseSeed += (deUint32)context.getTestContext().getCommandLine().getBaseSeed();

	for (int ndx = 0; ndx < numCases; ndx++)
		group->addChild(new RandomUniformBlockCase(context, de::toString(ndx).c_str(), "", glslVersion, bufferMode,
												   features, (deUint32)deInt32Hash(ndx + baseSeed)));
}